

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendstate.c
# Opt level: O0

int quicly_sendstate_lost(quicly_sendstate_t *state,quicly_sendstate_sent_t *args)

{
  int iVar1;
  quicly_ranges_t *in_RSI;
  quicly_sendstate_t *in_RDI;
  int ret;
  size_t acked_slot;
  uint64_t end;
  uint64_t start;
  size_t local_30;
  quicly_range_t *end_00;
  quicly_range_t *start_00;
  
  start_00 = in_RSI->ranges;
  end_00 = (quicly_range_t *)in_RSI->num_ranges;
  local_30 = 0;
  do {
    if (end_00 <= start_00) {
LAB_0015f3bc:
      if (((in_RDI->pending).num_ranges != 0) &&
         (((in_RDI->pending).ranges)->start < ((in_RDI->acked).ranges)->end)) {
        __assert_fail("state->pending.num_ranges == 0 || state->acked.ranges[0].end <= state->pending.ranges[0].start"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/sendstate.c"
                      ,0xac,
                      "int quicly_sendstate_lost(quicly_sendstate_t *, quicly_sendstate_sent_t *)");
      }
      iVar1 = check_amount_of_state(in_RDI);
      return iVar1;
    }
    if (start_00 < (quicly_range_t *)(in_RDI->acked).ranges[local_30].end) {
      start_00 = (quicly_range_t *)(in_RDI->acked).ranges[local_30].end;
    }
    local_30 = local_30 + 1;
    if ((local_30 == (in_RDI->acked).num_ranges) ||
       (end_00 <= (quicly_range_t *)(in_RDI->acked).ranges[local_30].start)) {
      if ((start_00 < end_00) &&
         (iVar1 = quicly_ranges_add(in_RSI,(uint64_t)start_00,(uint64_t)end_00), iVar1 != 0)) {
        return iVar1;
      }
      goto LAB_0015f3bc;
    }
    if ((start_00 < (quicly_range_t *)(in_RDI->acked).ranges[local_30].start) &&
       (iVar1 = quicly_ranges_add(in_RSI,(uint64_t)start_00,(uint64_t)end_00), iVar1 != 0)) {
      return iVar1;
    }
  } while( true );
}

Assistant:

int quicly_sendstate_lost(quicly_sendstate_t *state, quicly_sendstate_sent_t *args)
{
    uint64_t start = args->start, end = args->end;
    size_t acked_slot = 0;
    int ret;

    while (start < end) {
        if (start < state->acked.ranges[acked_slot].end)
            start = state->acked.ranges[acked_slot].end;
        ++acked_slot;
        if (acked_slot == state->acked.num_ranges || end <= state->acked.ranges[acked_slot].start) {
            if (start < end) {
                if ((ret = quicly_ranges_add(&state->pending, start, end)) != 0)
                    return ret;
            }
            goto Exit;
        }
        if (start < state->acked.ranges[acked_slot].start) {
            if ((ret = quicly_ranges_add(&state->pending, start, state->acked.ranges[acked_slot].start)) != 0)
                return ret;
        }
    }

Exit:
    assert(state->pending.num_ranges == 0 || state->acked.ranges[0].end <= state->pending.ranges[0].start);
    return check_amount_of_state(state);
}